

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

CropLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_crop(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xbe) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xbe;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CropLayerParams::CropLayerParams(this_00.crop_);
    (this->layer_).crop_ = (CropLayerParams *)this_00;
  }
  return (CropLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::CropLayerParams* NeuralNetworkLayer::mutable_crop() {
  if (!has_crop()) {
    clear_layer();
    set_has_crop();
    layer_.crop_ = new ::CoreML::Specification::CropLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.crop)
  return layer_.crop_;
}